

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  ostream *this;
  exception *e;
  undefined1 local_300 [8];
  VM vm_1;
  vector<Word,_std::allocator<Word>_> program_1;
  Assembler assembler_1;
  vector<Word,_std::allocator<Word>_> local_2a0;
  undefined1 local_288 [8];
  VM vm;
  vector<Word,_std::allocator<Word>_> program;
  Assembler assembler;
  istream local_220 [8];
  ifstream ifs;
  char **argv_local;
  int argc_local;
  
  std::ifstream::ifstream(local_220);
  if (argc == 1) {
    std::ifstream::open(local_220,"1.asm",8);
    bVar1 = std::ios::good();
    if ((bVar1 & 1) == 0) {
      __assert_fail("ifs.good()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cubuspl42[P]aghsm/main.cpp"
                    ,0xc,"int main(int, char **)");
    }
    Assembler::Assembler
              ((Assembler *)
               &program.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_220);
    Assembler::compile((vector<Word,_std::allocator<Word>_> *)
                       &vm._program.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                       (Assembler *)
                       &program.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    VM::VM((VM *)local_288);
    std::vector<Word,_std::allocator<Word>_>::vector
              (&local_2a0,
               (vector<Word,_std::allocator<Word>_> *)
               &vm._program.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    VM::load((VM *)local_288,&local_2a0);
    std::vector<Word,_std::allocator<Word>_>::~vector(&local_2a0);
    VM::run((VM *)local_288);
    VM::~VM((VM *)local_288);
    std::vector<Word,_std::allocator<Word>_>::~vector
              ((vector<Word,_std::allocator<Word>_> *)
               &vm._program.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  else if (argc == 2) {
    std::ifstream::open(local_220,argv[1],8);
    bVar1 = std::ios::good();
    if ((bVar1 & 1) == 0) {
      this = std::operator<<((ostream *)&std::cerr,"Unable to open file");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
      goto LAB_00125b29;
    }
    Assembler::Assembler
              ((Assembler *)
               &program_1.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_220);
    Assembler::compile((vector<Word,_std::allocator<Word>_> *)
                       &vm_1._program.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                       (Assembler *)
                       &program_1.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    VM::VM((VM *)local_300);
    std::vector<Word,_std::allocator<Word>_>::vector
              ((vector<Word,_std::allocator<Word>_> *)&e,
               (vector<Word,_std::allocator<Word>_> *)
               &vm_1._program.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    VM::load((VM *)local_300,(vector<Word,_std::allocator<Word>_> *)&e);
    std::vector<Word,_std::allocator<Word>_>::~vector((vector<Word,_std::allocator<Word>_> *)&e);
    VM::run((VM *)local_300);
    VM::~VM((VM *)local_300);
    std::vector<Word,_std::allocator<Word>_>::~vector
              ((vector<Word,_std::allocator<Word>_> *)
               &vm_1._program.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  argv_local._4_4_ = 0;
LAB_00125b29:
  std::ifstream::~ifstream(local_220);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
	std::ifstream ifs;

	if (argc == 1) {
		ifs.open("1.asm");
		assert(ifs.good());

		Assembler assembler(ifs);
		auto program = assembler.compile();
		VM vm;
		vm.load(program);
		vm.run();
	} else if (argc == 2) {
		ifs.open(argv[1]);
		
		if (!ifs.good()) {
			std::cerr << "Unable to open file" << std::endl;
			return 1;
		}

		try {
			Assembler assembler(ifs);
			auto program = assembler.compile();
			VM vm;
			vm.load(program);
			vm.run();
		} catch (std::exception &e) {
			std::cerr << e.what() << std::endl;
			return 1;
		}
	}

    return 0;
}